

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl.cpp
# Opt level: O2

void __thiscall
pg::DTLSolver::attractVertices
          (DTLSolver *this,int pl,int v,bitset *R,bitset *Z,bitset *G,int max_prio)

{
  ulong *puVar1;
  uint vertex;
  Game *pGVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  int *piVar6;
  int from;
  ulong uVar7;
  uint *puVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  _label_vertex local_50;
  bitset *local_40;
  bitset *local_38;
  
  pGVar2 = (this->super_Solver).game;
  puVar8 = (uint *)(pGVar2->_inedges + pGVar2->_firstins[v]);
  local_40 = G;
  local_38 = R;
  do {
    vertex = *puVar8;
    uVar7 = (ulong)(int)vertex;
    if (uVar7 == 0xffffffffffffffff) {
      return;
    }
    uVar12 = uVar7 >> 6;
    if ((Z->_bits[uVar12] >> (uVar7 & 0x3f) & 1) == 0) {
      uVar11 = 1L << (uVar7 & 0x3f);
      if (((local_38->_bits[uVar12] & uVar11) != 0) &&
         ((max_prio < 0 || (((this->super_Solver).game)->_priority[uVar7] <= max_prio)))) {
        iVar3 = Solver::owner(&this->super_Solver,vertex);
        if (iVar3 != pl) {
          pGVar2 = (this->super_Solver).game;
          for (piVar6 = pGVar2->_outedges + pGVar2->_firstouts[uVar7]; uVar10 = (ulong)*piVar6,
              uVar10 != 0xffffffffffffffff; piVar6 = piVar6 + 1) {
            if (((local_40->_bits[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0) &&
               ((Z->_bits[uVar10 >> 6] & 1L << (uVar10 & 0x3f)) == 0)) goto LAB_001661ab;
          }
        }
        puVar1 = Z->_bits + uVar12;
        *puVar1 = *puVar1 | uVar11;
        iVar4 = Solver::owner(&this->super_Solver,vertex);
        iVar3 = -1;
        if (iVar4 == pl) {
          iVar3 = v;
        }
        this->str[uVar7] = iVar3;
        iVar3 = (this->Q).pointer;
        (this->Q).pointer = iVar3 + 1;
        (this->Q).queue[iVar3] = vertex;
        if (2 < (this->super_Solver).trace) {
          poVar5 = std::operator<<((this->super_Solver).logger,"\x1b[1;37mattracted \x1b[36m");
          local_50.g = (this->super_Solver).game;
          local_50.v = vertex;
          poVar5 = operator<<(poVar5,&local_50);
          poVar5 = std::operator<<(poVar5,"\x1b[m by \x1b[1;36m");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,pl);
          std::operator<<(poVar5,"\x1b[m");
          iVar3 = Solver::owner(&this->super_Solver,vertex);
          poVar5 = (this->super_Solver).logger;
          if (iVar3 == pl) {
            poVar5 = std::operator<<(poVar5," (via ");
            local_50.g = (this->super_Solver).game;
            local_50.v = v;
            poVar5 = operator<<(poVar5,&local_50);
            pcVar9 = ")";
          }
          else {
            pcVar9 = " (forced)";
          }
          poVar5 = std::operator<<(poVar5,pcVar9);
          std::endl<char,std::char_traits<char>>(poVar5);
        }
      }
    }
    else {
      iVar3 = Solver::owner(&this->super_Solver,vertex);
      if ((iVar3 == pl) && (this->str[uVar7] == -1)) {
        this->str[uVar7] = v;
      }
    }
LAB_001661ab:
    puVar8 = puVar8 + 1;
  } while( true );
}

Assistant:

void
DTLSolver::attractVertices(const int pl, const int v, bitset &R, bitset &Z, bitset &G, const int max_prio)
{
    // attract vertices with an edge to <v>
    for (auto curedge = ins(v); *curedge != -1; curedge++) {
        int from = *curedge;
        if (Z[from]) {
            // already in Z, maybe set strategy (for vertices in the original target set)
            if (owner(from) == pl and str[from] == -1) str[from] = v;
        } else if (R[from] and (max_prio < 0 or priority(from) <= max_prio)) {
            if (owner(from) != pl) {
                // check if opponent can escape
                bool escapes = false;
                for (auto curedge = outs(from); *curedge != -1; curedge++) {
                    int to = *curedge;
                    if (G[to] and !Z[to]) {
                        escapes = true;
                        break;
                    }
                }
                if (escapes) continue;
            }
            // attract
            Z[from] = true;
            str[from] = owner(from) == pl ? v : -1;
            Q.push(from);
#ifndef NDEBUG
            // maybe report event
            if (trace >= 3) {
                logger << "\033[1;37mattracted \033[36m" << label_vertex(from) << "\033[m by \033[1;36m" << pl << "\033[m";
                if (owner(from) == pl) logger << " (via " << label_vertex(v) << ")" << std::endl;
                else logger << " (forced)" << std::endl;
            }
#endif
        }
    }
}